

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
cppcms::impl::cgi::fastcgi_api_unix_socket_factory(service *srv,string *socket,int backlog)

{
  undefined4 in_ECX;
  string *in_RDX;
  acceptor *in_RDI;
  unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_> *a;
  _Head_base<0UL,_cppcms::impl::cgi::acceptor_*,_false> this;
  string local_40 [12];
  int in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  service *in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar1;
  
  uVar1 = (uint)in_stack_ffffffffffffffe0;
  this._M_head_impl = in_RDI;
  operator_new(0x68);
  std::__cxx11::string::string(local_40,in_RDX);
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  ::socket_acceptor((socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
                     *)CONCAT44(in_ECX,uVar1),in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  std::unique_ptr<cppcms::impl::cgi::acceptor,std::default_delete<cppcms::impl::cgi::acceptor>>::
  unique_ptr<std::default_delete<cppcms::impl::cgi::acceptor>,void>
            ((unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
              *)this._M_head_impl,in_RDI);
  std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
          )(tuple<cppcms::impl::cgi::acceptor_*,_std::default_delete<cppcms::impl::cgi::acceptor>_>)
           this._M_head_impl;
}

Assistant:

std::unique_ptr<acceptor> fastcgi_api_unix_socket_factory(cppcms::service &srv,std::string socket,int backlog)
	{
		std::unique_ptr<acceptor> a(new socket_acceptor<fastcgi>(srv,socket,backlog));
		return a;
	}